

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_ckpt_set_interval(char *fn)

{
  int iVar1;
  FILE *__stream;
  uint32 rl;
  uint32 o;
  uint32 local_20;
  uint32 local_1c;
  
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x1e7,"Can\'t open ckpt file %s",fn);
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%u %u",&local_1c,&local_20);
    if (iVar1 == 2) {
      fclose(__stream);
      corpus_set_interval(local_1c,local_20);
      return 0;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x1ed,"Problems reading ckpt file %s\n",fn);
    fclose(__stream);
  }
  return -1;
}

Assistant:

int
corpus_ckpt_set_interval(const char *fn)
{
    FILE *fp;
    uint32 o, rl;

    fp = fopen(fn, "r");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Can't open ckpt file %s", fn);

	return S3_ERROR;
    }

    if (fscanf(fp, "%u %u", &o, &rl) != 2) {
	E_ERROR("Problems reading ckpt file %s\n", fn);
	fclose(fp);

	return S3_ERROR;
    }

    fclose(fp);

    return corpus_set_interval(o, rl);
}